

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

void __thiscall cppcms::widgets::text::text(text *this,string *type)

{
  string *in_RSI;
  void **in_RDI;
  base_text *unaff_retaddr;
  void **vtt;
  
  vtt = in_RDI;
  base_widget::base_widget((base_widget *)this);
  base_html_input::base_html_input((base_html_input *)unaff_retaddr,vtt,in_RSI);
  base_text::base_text(unaff_retaddr,vtt);
  *in_RDI = vtable + 0x18;
  in_RDI[0x11] = vtable + 0xd0;
  in_RDI[6] = vtable + 0x58;
  *(undefined4 *)(in_RDI + 0xf) = 0xffffffff;
  booster::hold_ptr<cppcms::widgets::text::_data>::hold_ptr
            ((hold_ptr<cppcms::widgets::text::_data> *)(in_RDI + 0x10));
  return;
}

Assistant:

text::text(std::string const &type): base_html_input(type), size_(-1) {}